

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Teleport_NewMap(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  bool bVar1;
  level_info_t *info;
  undefined7 in_register_00000011;
  int iVar2;
  
  iVar2 = 0;
  if (((int)CONCAT71(in_register_00000011,backSide) == 0) || (gameinfo.gametype == GAME_Strife)) {
    info = FindLevelByNum(arg0);
    if (info != (level_info_t *)0x0) {
      bVar1 = CheckIfExitIsGood(it,info);
      iVar2 = 0;
      if (bVar1) {
        G_ChangeLevel((info->MapName).Chars,arg1,(uint)(arg2 != 0),-1);
        iVar2 = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

FUNC(LS_Teleport_NewMap)
// Teleport_NewMap (map, position, keepFacing?)
{
	if (backSide == 0 || gameinfo.gametype == GAME_Strife)
	{
		level_info_t *info = FindLevelByNum (arg0);

		if (info && CheckIfExitIsGood (it, info))
		{
			G_ChangeLevel(info->MapName, arg1, arg2 ? CHANGELEVEL_KEEPFACING : 0);
			return true;
		}
	}
	return false;
}